

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O0

string * hashStr(string *__return_storage_ptr__,uint32_t param_1,size_t n,string *default_value,
                string *map_name,string *key_type,bool nonKeyLookups)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_3a;
  byte local_39;
  string *psStack_38;
  bool nonKeyLookups_local;
  string *key_type_local;
  string *map_name_local;
  string *default_value_local;
  size_t n_local;
  string *psStack_10;
  uint32_t param_0_local;
  string *hash;
  
  local_39 = nonKeyLookups;
  local_3a = 0;
  psStack_38 = key_type;
  key_type_local = map_name;
  map_name_local = default_value;
  default_value_local = (string *)n;
  n_local._4_4_ = param_1;
  psStack_10 = __return_storage_ptr__;
  hashStr_abi_cxx11_(&local_120,0);
  std::operator+(&local_100,&local_120,"};\n\nconstexpr std::string_view ");
  std::operator+(&local_e0,&local_100,map_name);
  std::operator+(&local_c0,&local_e0,"::lookup(const ");
  std::operator+(&local_a0,&local_c0,key_type);
  std::operator+(&local_80,&local_a0,"& key) noexcept{\n    const size_t h = hash(key) & ");
  std::__cxx11::to_string(&local_150,(unsigned_long)default_value_local);
  std::operator+(&local_60,&local_80,&local_150);
  std::operator+(__return_storage_ptr__,&local_60,";\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  if ((local_39 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "    #ifndef NDEBUG\n    assert(keys[h] == key);\n    #endif\n\n    return std::string_view(&flat_vals[val_start[h]], val_size[h]);\n"
              );
  }
  else {
    std::operator+(&local_190,
                   "    return keys[h] == key ? std::string_view(&flat_vals[val_start[h]], val_size[h]) : \""
                   ,map_name_local);
    std::operator+(&local_170,&local_190,"\";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}\n\n");
  return __return_storage_ptr__;
}

Assistant:

std::string hashStr(uint32_t, size_t n, const std::string& default_value, std::string map_name, std::string key_type, bool nonKeyLookups){
    std::string hash = hashStr(uint32_t()) +
        "};\n"
        "\n"
        "constexpr std::string_view " + map_name + "::lookup(const " + key_type + "& key) noexcept{\n"
        "    const size_t h = hash(key) & " + std::to_string(n) + ";\n";
    if(nonKeyLookups) hash +=
        "    return keys[h] == key ? std::string_view(&flat_vals[val_start[h]], val_size[h]) : \"" + default_value + "\";\n";
    else hash +=
        "    #ifndef NDEBUG\n"
        "    assert(keys[h] == key);\n"
        "    #endif\n\n"
        "    return std::string_view(&flat_vals[val_start[h]], val_size[h]);\n";

    hash += "}\n\n";

    return hash;
}